

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O2

ssize_t __thiscall
Centaurus::SymbolContext<char>::read_abi_cxx11_
          (SymbolContext<char> *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  long lVar3;
  
  lVar3 = ((long *)CONCAT44(in_register_00000034,__fd))[1];
  lVar2 = *(long *)(lVar3 + 8);
  iVar1 = *(int *)(lVar3 + 0x10);
  lVar3 = *(long *)(*(long *)CONCAT44(in_register_00000034,__fd) + 8);
  this->context = (ParseContext<char> *)&this->values;
  lVar3 = lVar3 + lVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,lVar3,(iVar1 - (int)lVar2) + lVar3)
  ;
  return (ssize_t)this;
}

Assistant:

std::basic_string<TCHAR> read() const
  {
    const TCHAR *p = reinterpret_cast<const TCHAR *>(context.m_window) + symbol.start;
    return std::basic_string<TCHAR>(p, len());
  }